

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_mc_flow_dispenser_mt(AV1_COMP *cpi)

{
  ThreadData_conflict *__src;
  EncWorkerData *pEVar1;
  AV1TplRowMultiThreadSync *tpl_sync;
  uint uVar2;
  AV1_PRIMARY *pAVar3;
  AVxWorker *pAVar4;
  EncWorkerData *pEVar5;
  ThreadData_conflict *pTVar6;
  CONV_BUF_TYPE *pCVar7;
  undefined1 *puVar8;
  pthread_mutex_t *ppVar9;
  pthread_cond_t *ppVar10;
  int *piVar11;
  ulong uVar12;
  uint8_t *puVar13;
  int16_t *piVar14;
  tran_low_t *ptVar15;
  long lVar16;
  int iVar17;
  long lVar19;
  uint num_workers;
  ulong uVar20;
  uint uVar18;
  
  pAVar3 = cpi->ppi;
  uVar18 = (cpi->common).mi_params.mb_rows;
  lVar19 = (long)(int)uVar18;
  uVar2 = (cpi->mt_info).num_mod_workers[2];
  num_workers = (cpi->mt_info).num_workers;
  if ((int)uVar2 < (int)num_workers) {
    num_workers = uVar2;
  }
  if (uVar18 != (pAVar3->tpl_data).tpl_mt_sync.rows) {
    tpl_sync = &(pAVar3->tpl_data).tpl_mt_sync;
    av1_tpl_dealloc(tpl_sync);
    (pAVar3->tpl_data).tpl_mt_sync.rows = uVar18;
    ppVar9 = (pthread_mutex_t *)aom_malloc(lVar19 * 0x28);
    (pAVar3->tpl_data).tpl_mt_sync.mutex_ = ppVar9;
    if ((ppVar9 != (pthread_mutex_t *)0x0) ||
       (aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate tpl_sync->mutex_"),
       tpl_sync->mutex_ != (pthread_mutex_t *)0x0)) {
      lVar16 = 0;
      uVar12 = 0;
      if (0 < (int)uVar18) {
        uVar12 = (ulong)uVar18;
      }
      for (; uVar12 * 0x28 - lVar16 != 0; lVar16 = lVar16 + 0x28) {
        pthread_mutex_init((pthread_mutex_t *)((long)tpl_sync->mutex_ + lVar16),
                           (pthread_mutexattr_t *)0x0);
      }
    }
    ppVar10 = (pthread_cond_t *)aom_malloc(lVar19 * 0x30);
    (pAVar3->tpl_data).tpl_mt_sync.cond_ = ppVar10;
    if ((ppVar10 != (pthread_cond_t *)0x0) ||
       (aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate tpl_sync->cond_"),
       (pAVar3->tpl_data).tpl_mt_sync.cond_ != (pthread_cond_t *)0x0)) {
      uVar20 = 0;
      uVar12 = (ulong)uVar18;
      if ((int)uVar18 < 1) {
        uVar12 = uVar20;
      }
      for (; uVar12 * 0x30 - uVar20 != 0; uVar20 = uVar20 + 0x30) {
        pthread_cond_init((pthread_cond_t *)((long)(pAVar3->tpl_data).tpl_mt_sync.cond_ + uVar20),
                          (pthread_condattr_t *)0x0);
      }
    }
    piVar11 = (int *)aom_malloc(lVar19 << 2);
    (pAVar3->tpl_data).tpl_mt_sync.num_finished_cols = piVar11;
    if (piVar11 == (int *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tpl_sync->num_finished_cols");
    }
    (pAVar3->tpl_data).tpl_mt_sync.sync_range = 1;
  }
  (pAVar3->tpl_data).tpl_mt_sync.num_threads_working = num_workers;
  (cpi->mt_info).tpl_row_mt.tpl_mt_exit = false;
  memset((pAVar3->tpl_data).tpl_mt_sync.num_finished_cols,0xff,lVar19 << 2);
  __src = &cpi->td;
  uVar12 = (ulong)num_workers;
  while (iVar17 = (int)uVar12, 0 < iVar17) {
    uVar12 = uVar12 - 1;
    uVar20 = uVar12 & 0xffffffff;
    pAVar4 = (cpi->mt_info).workers;
    pEVar5 = (cpi->mt_info).tile_thr_data;
    pEVar1 = pEVar5 + uVar20;
    pAVar4[uVar20].hook = tpl_worker_hook;
    pAVar4[uVar20].data1 = pEVar1;
    pAVar4[uVar20].data2 = (void *)0x0;
    pEVar5[uVar20].thread_id = iVar17 + -1;
    pEVar5[uVar20].start = iVar17 + -1;
    pEVar5[uVar20].cpi = cpi;
    if (iVar17 == 1) {
      pEVar1->td = __src;
    }
    else {
      pTVar6 = pEVar1->original_td;
      pEVar1->td = pTVar6;
      if (pTVar6 != __src) {
        memcpy(pTVar6,__src,0x256b0);
        av1_init_obmc_buffer(&(pEVar1->td->mb).obmc_buffer);
        pTVar6 = pEVar1->td;
        uVar18 = (uint)(cpi->ppi->tpl_data).tpl_bsize_1d;
        iVar17 = uVar18 * uVar18;
        uVar20 = (ulong)(uint)(iVar17 * 2);
        puVar13 = (uint8_t *)aom_memalign(0x20,uVar20);
        (pTVar6->tpl_tmp_buffers).predictor8 = puVar13;
        piVar14 = (int16_t *)aom_memalign(0x20,uVar20);
        (pTVar6->tpl_tmp_buffers).src_diff = piVar14;
        uVar20 = (ulong)(uint)(iVar17 * 4);
        ptVar15 = (tran_low_t *)aom_memalign(0x20,uVar20);
        (pTVar6->tpl_tmp_buffers).coeff = ptVar15;
        ptVar15 = (tran_low_t *)aom_memalign(0x20,uVar20);
        (pTVar6->tpl_tmp_buffers).qcoeff = ptVar15;
        ptVar15 = (tran_low_t *)aom_memalign(0x20,uVar20);
        (pTVar6->tpl_tmp_buffers).dqcoeff = ptVar15;
        if (((((pTVar6->tpl_tmp_buffers).predictor8 == (uint8_t *)0x0) ||
             ((pTVar6->tpl_tmp_buffers).src_diff == (int16_t *)0x0)) ||
            ((pTVar6->tpl_tmp_buffers).coeff == (tran_low_t *)0x0)) ||
           (((pTVar6->tpl_tmp_buffers).qcoeff == (tran_low_t *)0x0 || (ptVar15 == (tran_low_t *)0x0)
            ))) {
          tpl_dealloc_temp_buffers(&pTVar6->tpl_tmp_buffers);
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Error allocating tpl data");
        }
        pTVar6 = pEVar1->td;
        pCVar7 = pTVar6->tmp_conv_dst;
        (pTVar6->mb).tmp_conv_dst = pCVar7;
        (pTVar6->mb).e_mbd.tmp_conv_dst = pCVar7;
      }
    }
  }
  launch_workers(&cpi->mt_info,num_workers);
  sync_enc_workers(&cpi->mt_info,&cpi->common,num_workers);
  lVar19 = (ulong)num_workers * 0x1d0 + -0x1c8;
  for (; 0 < (int)num_workers; num_workers = num_workers - 1) {
    puVar8 = *(undefined1 **)((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar19 + -0x20);
    if ((ThreadData_conflict *)puVar8 != __src) {
      tpl_dealloc_temp_buffers((TplBuffers *)(puVar8 + 0x25dc0));
    }
    lVar19 = lVar19 + -0x1d0;
  }
  return;
}

Assistant:

void av1_mc_flow_dispenser_mt(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CommonModeInfoParams *mi_params = &cm->mi_params;
  MultiThreadInfo *mt_info = &cpi->mt_info;
  TplParams *tpl_data = &cpi->ppi->tpl_data;
  AV1TplRowMultiThreadSync *tpl_sync = &tpl_data->tpl_mt_sync;
  int mb_rows = mi_params->mb_rows;
  int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_TPL], mt_info->num_workers);

  if (mb_rows != tpl_sync->rows) {
    av1_tpl_dealloc(tpl_sync);
    av1_tpl_alloc(tpl_sync, cm, mb_rows);
  }
  tpl_sync->num_threads_working = num_workers;
  mt_info->tpl_row_mt.tpl_mt_exit = false;

  // Initialize cur_mb_col to -1 for all MB rows.
  memset(tpl_sync->num_finished_cols, -1,
         sizeof(*tpl_sync->num_finished_cols) * mb_rows);

  prepare_tpl_workers(cpi, tpl_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
#if CONFIG_BITRATE_ACCURACY
  tpl_accumulate_txfm_stats(&cpi->td, &cpi->mt_info, num_workers);
#endif  // CONFIG_BITRATE_ACCURACY
  for (int i = num_workers - 1; i >= 0; i--) {
    EncWorkerData *thread_data = &mt_info->tile_thr_data[i];
    ThreadData *td = thread_data->td;
    if (td != &cpi->td) tpl_dealloc_temp_buffers(&td->tpl_tmp_buffers);
  }
}